

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O2

void rxa2_initial_hash(uint8_t *blockhash,argon2_context *context,argon2_type type)

{
  uint8_t value [4];
  blake2b_state BlakeHash;
  
  if (blockhash != (uint8_t *)0x0 && context != (argon2_context *)0x0) {
    randomx_blake2b_init(&BlakeHash,0x40);
    value = (uint8_t  [4])context->lanes;
    randomx_blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->outlen;
    randomx_blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->m_cost;
    randomx_blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->t_cost;
    randomx_blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->version;
    randomx_blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])type;
    randomx_blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->pwdlen;
    randomx_blake2b_update(&BlakeHash,value,4);
    if (context->pwd != (uint8_t *)0x0) {
      randomx_blake2b_update(&BlakeHash,context->pwd,(ulong)context->pwdlen);
    }
    value = (uint8_t  [4])context->saltlen;
    randomx_blake2b_update(&BlakeHash,value,4);
    if (context->salt != (uint8_t *)0x0) {
      randomx_blake2b_update(&BlakeHash,context->salt,(ulong)context->saltlen);
    }
    value = (uint8_t  [4])context->secretlen;
    randomx_blake2b_update(&BlakeHash,value,4);
    if (context->secret != (uint8_t *)0x0) {
      randomx_blake2b_update(&BlakeHash,context->secret,(ulong)context->secretlen);
    }
    value = (uint8_t  [4])context->adlen;
    randomx_blake2b_update(&BlakeHash,value,4);
    if (context->ad != (uint8_t *)0x0) {
      randomx_blake2b_update(&BlakeHash,context->ad,(ulong)context->adlen);
    }
    randomx_blake2b_final(&BlakeHash,blockhash,0x40);
  }
  return;
}

Assistant:

void rxa2_initial_hash(uint8_t *blockhash, argon2_context *context, argon2_type type) {
	blake2b_state BlakeHash;
	uint8_t value[sizeof(uint32_t)];

	if (NULL == context || NULL == blockhash) {
		return;
	}

	blake2b_init(&BlakeHash, ARGON2_PREHASH_DIGEST_LENGTH);

	store32(&value, context->lanes);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->outlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->m_cost);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->t_cost);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->version);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, (uint32_t)type);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->pwdlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->pwd != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->pwd,
			context->pwdlen);
	}

	store32(&value, context->saltlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->salt != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->salt, context->saltlen);
	}

	store32(&value, context->secretlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->secret != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->secret,
			context->secretlen);
	}

	store32(&value, context->adlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->ad != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->ad,
			context->adlen);
	}

	blake2b_final(&BlakeHash, blockhash, ARGON2_PREHASH_DIGEST_LENGTH);
}